

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hackdemo.cpp
# Opt level: O1

int main(void)

{
  _func_void_int *p_Var1;
  long *plVar2;
  int binding;
  hackfunc<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_hackdemo_cpp:23:7),_void>
  fn2;
  hackfunc<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_hackdemo_cpp:16:7),_void>
  fn;
  int local_7c;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_50;
  _Manager_type local_40;
  _Any_data local_30;
  _Manager_type local_20;
  
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/hackdemo.cpp:16:7)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/hackdemo.cpp:16:7)>
             ::_M_manager;
  std::function<void_(int)>::function
            ((function<void_(int)> *)&local_30,(function<void_(int)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  p_Var1 = (_func_void_int *)mmap((void *)0x0,0x18,7,0x22,-1,0);
  *(undefined2 *)p_Var1 = 0xba49;
  *(_Any_data **)(p_Var1 + 2) = &local_30;
  *(undefined2 *)(p_Var1 + 10) = 0xb848;
  *(code **)(p_Var1 + 0xc) = func_ptr::details::hackfunc_impl<void,_int>::wrapper;
  *(undefined2 *)(p_Var1 + 0x14) = 0xe0ff;
  fake_clib_func(p_Var1);
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = &local_7c;
  pcStack_60 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/hackdemo.cpp:23:7)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/hackdemo.cpp:23:7)>
             ::_M_manager;
  std::function<void_(int)>::function
            ((function<void_(int)> *)&local_50,(function<void_(int)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  p_Var1 = (_func_void_int *)mmap((void *)0x0,0x18,7,0x22,-1,0);
  *(undefined2 *)p_Var1 = 0xba49;
  *(_Any_data **)(p_Var1 + 2) = &local_50;
  *(undefined2 *)(p_Var1 + 10) = 0xb848;
  *(code **)(p_Var1 + 0xc) = func_ptr::details::hackfunc_impl<void,_int>::wrapper;
  *(undefined2 *)(p_Var1 + 0x14) = 0xe0ff;
  fake_clib_func(p_Var1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[main] got ",0xb);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_7c);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return 0;
}

Assistant:

int main() {
  hackfunc fn{
      [](int input) { std::cout << "directly: " << input << std::endl; }};
  
  fake_clib_func(fn);

  int binding;

  hackfunc fn2{
      [&](int input) { binding = input; }};
  
  fake_clib_func(fn2);
  std::cout << "[main] got " << binding << std::endl;
}